

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
AssertCheckHeapBlockNotInAnyList
          (HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this,
          SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = HeapBlockList::Contains<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                    (heapBlock,this->heapBlockList,
                     (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x19e,"(!HeapBlockList::Contains(heapBlock, heapBlockList))",
                       "The heap block already exists in the heapBlockList.");
    if (!bVar2) goto LAB_0063ad06;
    *puVar3 = 0;
  }
  bVar2 = HeapBlockList::Contains<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                    (heapBlock,this->fullBlockList,
                     (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x19f,"(!HeapBlockList::Contains(heapBlock, fullBlockList))",
                       "The heap block already exists in the fullBlockList.");
    if (!bVar2) goto LAB_0063ad06;
    *puVar3 = 0;
  }
  bVar2 = HeapBlockList::Contains<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                    (heapBlock,this->emptyBlockList,
                     (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1a0,"(!HeapBlockList::Contains(heapBlock, emptyBlockList))",
                       "The heap block already exists in the emptyBlockList.");
    if (!bVar2) {
LAB_0063ad06:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::AssertCheckHeapBlockNotInAnyList(TBlockType * heapBlock)
{
#if DBG
    AssertMsg(!HeapBlockList::Contains(heapBlock, heapBlockList), "The heap block already exists in the heapBlockList.");
    AssertMsg(!HeapBlockList::Contains(heapBlock, fullBlockList), "The heap block already exists in the fullBlockList.");
    AssertMsg(!HeapBlockList::Contains(heapBlock, emptyBlockList), "The heap block already exists in the emptyBlockList.");
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    AssertMsg(!HeapBlockList::Contains(heapBlock, sweepableHeapBlockList), "The heap block already exists in the sweepableHeapBlockList.");
#endif
#endif
}